

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

TokenStream * __thiscall Catch::clara::detail::TokenStream::operator++(TokenStream *this)

{
  bool bVar1;
  size_type sVar2;
  iterator __position;
  TokenStream *in_RDI;
  TokenStream *in_stack_00000130;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
  *in_stack_ffffffffffffffe0;
  
  sVar2 = std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          size(&in_RDI->m_tokenBuffer);
  if (sVar2 < 2) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&in_RDI->it);
    }
    loadBuffer(in_stack_00000130);
  }
  else {
    this_00 = &in_RDI->m_tokenBuffer;
    __position = std::
                 vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
                 begin(in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::Token_const*,std::vector<Catch::clara::detail::Token,std::allocator<Catch::clara::detail::Token>>>
    ::__normal_iterator<Catch::clara::detail::Token*>
              ((__normal_iterator<const_Catch::clara::detail::Token_*,_std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>_>
                *)this_00,
               (__normal_iterator<Catch::clara::detail::Token_*,_std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>_>
                *)in_stack_ffffffffffffffc8);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::erase
              (in_stack_ffffffffffffffe0,(const_iterator)__position._M_current);
  }
  return in_RDI;
}

Assistant:

auto operator++() -> TokenStream & {
            if( m_tokenBuffer.size() >= 2 ) {
                m_tokenBuffer.erase( m_tokenBuffer.begin() );
            } else {
                if( it != itEnd )
                    ++it;
                loadBuffer();
            }
            return *this;
        }